

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

FmsInt CompareIntData(FmsIntType itype,FmsInt size,void *lhs,void *rhs)

{
  FmsInt FVar1;
  FmsInt FVar2;
  bool bVar3;
  
  if (lhs == rhs) {
    return 0;
  }
  FVar1 = 1;
  if (rhs != (void *)0x0 && lhs != (void *)0x0) {
    switch(itype) {
    case FMS_INT8:
      if (size == 0) {
        return 0;
      }
      FVar1 = 0;
      FVar2 = 1;
      do {
        if (*(char *)((long)lhs + (FVar2 - 1)) != *(char *)((long)rhs + (FVar2 - 1))) {
          return FVar2;
        }
        bVar3 = FVar2 != size;
        FVar2 = FVar2 + 1;
      } while (bVar3);
      break;
    case FMS_INT16:
      if (size == 0) {
        return 0;
      }
      FVar1 = 0;
      FVar2 = 1;
      do {
        if (*(short *)((long)lhs + FVar2 * 2 + -2) != *(short *)((long)rhs + FVar2 * 2 + -2)) {
          return FVar2;
        }
        bVar3 = FVar2 != size;
        FVar2 = FVar2 + 1;
      } while (bVar3);
      break;
    case FMS_INT32:
      if (size == 0) {
        return 0;
      }
      FVar1 = 0;
      FVar2 = 1;
      do {
        if (*(int *)((long)lhs + FVar2 * 4 + -4) != *(int *)((long)rhs + FVar2 * 4 + -4)) {
          return FVar2;
        }
        bVar3 = FVar2 != size;
        FVar2 = FVar2 + 1;
      } while (bVar3);
      break;
    case FMS_INT64:
      if (size == 0) {
        return 0;
      }
      FVar1 = 0;
      FVar2 = 1;
      do {
        if (*(long *)((long)lhs + FVar2 * 8 + -8) != *(long *)((long)rhs + FVar2 * 8 + -8)) {
          return FVar2;
        }
        bVar3 = FVar2 != size;
        FVar2 = FVar2 + 1;
      } while (bVar3);
      break;
    case FMS_ORIENTATION_INT_TYPE:
      if (size == 0) {
        return 0;
      }
      FVar1 = 0;
      FVar2 = 1;
      do {
        if (*(char *)((long)lhs + (FVar2 - 1)) != *(char *)((long)rhs + (FVar2 - 1))) {
          return FVar2;
        }
        bVar3 = FVar2 != size;
        FVar2 = FVar2 + 1;
      } while (bVar3);
      break;
    case FMS_UINT16:
      if (size == 0) {
        return 0;
      }
      FVar1 = 0;
      FVar2 = 1;
      do {
        if (*(short *)((long)lhs + FVar2 * 2 + -2) != *(short *)((long)rhs + FVar2 * 2 + -2)) {
          return FVar2;
        }
        bVar3 = FVar2 != size;
        FVar2 = FVar2 + 1;
      } while (bVar3);
      break;
    case FMS_UINT32:
      if (size == 0) {
        return 0;
      }
      FVar1 = 0;
      FVar2 = 1;
      do {
        if (*(int *)((long)lhs + FVar2 * 4 + -4) != *(int *)((long)rhs + FVar2 * 4 + -4)) {
          return FVar2;
        }
        bVar3 = FVar2 != size;
        FVar2 = FVar2 + 1;
      } while (bVar3);
      break;
    case FMS_INT_TYPE:
      if (size == 0) {
        return 0;
      }
      FVar1 = 0;
      FVar2 = 1;
      do {
        if (*(long *)((long)lhs + FVar2 * 8 + -8) != *(long *)((long)rhs + FVar2 * 8 + -8)) {
          return FVar2;
        }
        bVar3 = FVar2 != size;
        FVar2 = FVar2 + 1;
      } while (bVar3);
      break;
    default:
      return 2;
    }
  }
  return FVar1;
}

Assistant:

static inline FmsInt CompareIntData(FmsIntType itype, FmsInt size,
                                    const void *lhs, const void *rhs) {
  if(lhs == rhs) return 0;
  if(!lhs) return 1;
  if(!rhs) return 1;
  FmsInt isDifferent = 0;
  switch(itype) {
  case FMS_INT8:
    COMPARE_INT_DATA(int8_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT16:
    COMPARE_INT_DATA(int16_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT32:
    COMPARE_INT_DATA(int32_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_INT64:
    COMPARE_INT_DATA(int64_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT8:
    COMPARE_INT_DATA(uint8_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT16:
    COMPARE_INT_DATA(uint16_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT32:
    COMPARE_INT_DATA(uint32_t, lhs, rhs, size, isDifferent);
    break;
  case FMS_UINT64:
    COMPARE_INT_DATA(uint64_t, lhs, rhs, size, isDifferent);
    break;
  default:
    return 2;
  }
  return isDifferent;
}